

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostInfo_p.cpp
# Opt level: O2

HostInfo *
BamTools::Internal::HostInfo::Lookup(HostInfo *__return_storage_ptr__,string *hostname,string *port)

{
  string *psVar1;
  _Rb_tree_header *__last;
  uint uVar2;
  addrinfo *paVar3;
  socklen_t __salen;
  bool bVar4;
  int iVar5;
  NetworkProtocol NVar6;
  uint32_t uVar7;
  sockaddr *__sa;
  addrinfo **__pai;
  IPv6Address IVar8;
  allocator local_529;
  addrinfo *res;
  size_type local_520;
  undefined1 local_504 [12];
  undefined8 uStack_4f8;
  undefined4 uStack_4f0;
  undefined4 uStack_4ec;
  sockaddr local_4e8;
  HostAddress address;
  set<BamTools::Internal::HostAddress,_std::less<BamTools::Internal::HostAddress>,_std::allocator<BamTools::Internal::HostAddress>_>
  uniqueAddresses;
  char serv [32];
  char hbuf [1025];
  
  (__return_storage_ptr__->m_hostName)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_hostName).field_2;
  (__return_storage_ptr__->m_hostName)._M_string_length = 0;
  (__return_storage_ptr__->m_hostName).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->m_addresses).
  super__Vector_base<BamTools::Internal::HostAddress,_std::allocator<BamTools::Internal::HostAddress>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_addresses).
  super__Vector_base<BamTools::Internal::HostAddress,_std::allocator<BamTools::Internal::HostAddress>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->m_addresses).
           super__Vector_base<BamTools::Internal::HostAddress,_std::allocator<BamTools::Internal::HostAddress>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->m_addresses).
           super__Vector_base<BamTools::Internal::HostAddress,_std::allocator<BamTools::Internal::HostAddress>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (__return_storage_ptr__->m_errorString)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorString).field_2;
  (__return_storage_ptr__->m_errorString)._M_string_length = 0;
  (__return_storage_ptr__->m_errorString).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  __last = &uniqueAddresses._M_t._M_impl.super__Rb_tree_header;
  uniqueAddresses._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uniqueAddresses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  uniqueAddresses._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uniqueAddresses._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &__last->_M_header;
  uniqueAddresses._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &__last->_M_header;
  HostAddress::HostAddress(&address);
  HostAddress::SetAddress(&address,hostname);
  bVar4 = HostAddress::HasIPAddress(&address);
  if (!bVar4) {
    serv[0] = '\0';
    serv[1] = '\0';
    serv[2] = '\0';
    serv[3] = '\0';
    serv[4] = '\0';
    serv[5] = '\0';
    serv[6] = '\0';
    serv[7] = '\0';
    serv[0x10] = '\0';
    serv[0x11] = '\0';
    serv[0x12] = '\0';
    serv[0x13] = '\0';
    serv[0x14] = '\0';
    serv[0x15] = '\0';
    serv[0x16] = '\0';
    serv[0x17] = '\0';
    serv[0x18] = '\0';
    serv[0x19] = '\0';
    serv[0x1a] = '\0';
    serv[0x1b] = '\0';
    serv[0x1c] = '\0';
    serv[0x1d] = '\0';
    serv[0x1e] = '\0';
    serv[0x1f] = '\0';
    serv[8] = '\x01';
    serv[9] = '\0';
    serv[10] = '\0';
    serv[0xb] = '\0';
    serv[0xc] = '\x06';
    serv[0xd] = '\0';
    serv[0xe] = '\0';
    serv[0xf] = '\0';
    __pai = (addrinfo **)&res;
    iVar5 = getaddrinfo((hostname->_M_dataplus)._M_p,(port->_M_dataplus)._M_p,(addrinfo *)serv,__pai
                       );
    psVar1 = &__return_storage_ptr__->m_errorString;
    if ((iVar5 + 5U < 2) || (iVar5 == -2)) {
      __return_storage_ptr__->m_error = HostNotFound;
      std::__cxx11::string::string((string *)hbuf,"HostInfo: host not found",(allocator *)local_504)
      ;
      std::__cxx11::string::_M_assign((string *)psVar1);
LAB_00150a4f:
      std::__cxx11::string::~string((string *)hbuf);
    }
    else {
      if (iVar5 != 0) {
        __return_storage_ptr__->m_error = UnknownError;
        std::__cxx11::string::string
                  ((string *)hbuf,"HostInfo: unknown error encountered",(allocator *)local_504);
        std::__cxx11::string::_M_assign((string *)psVar1);
        goto LAB_00150a4f;
      }
      while (paVar3 = *__pai, paVar3 != (addrinfo *)0x0) {
        if (paVar3->ai_family == 10) {
          HostAddress::HostAddress((HostAddress *)hbuf,(uint8_t *)(paVar3->ai_addr->sa_data + 6));
          std::
          _Rb_tree<BamTools::Internal::HostAddress,BamTools::Internal::HostAddress,std::_Identity<BamTools::Internal::HostAddress>,std::less<BamTools::Internal::HostAddress>,std::allocator<BamTools::Internal::HostAddress>>
          ::_M_insert_unique<BamTools::Internal::HostAddress_const&>
                    ((_Rb_tree<BamTools::Internal::HostAddress,BamTools::Internal::HostAddress,std::_Identity<BamTools::Internal::HostAddress>,std::less<BamTools::Internal::HostAddress>,std::allocator<BamTools::Internal::HostAddress>>
                      *)&uniqueAddresses,(HostAddress *)hbuf);
LAB_001508bd:
          std::__cxx11::string::~string((string *)(hbuf + 0x18));
        }
        else if (paVar3->ai_family == 2) {
          uVar2 = *(uint *)(paVar3->ai_addr->sa_data + 2);
          HostAddress::HostAddress
                    ((HostAddress *)hbuf,
                     uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18
                    );
          std::
          _Rb_tree<BamTools::Internal::HostAddress,BamTools::Internal::HostAddress,std::_Identity<BamTools::Internal::HostAddress>,std::less<BamTools::Internal::HostAddress>,std::allocator<BamTools::Internal::HostAddress>>
          ::_M_insert_unique<BamTools::Internal::HostAddress_const&>
                    ((_Rb_tree<BamTools::Internal::HostAddress,BamTools::Internal::HostAddress,std::_Identity<BamTools::Internal::HostAddress>,std::less<BamTools::Internal::HostAddress>,std::allocator<BamTools::Internal::HostAddress>>
                      *)&uniqueAddresses,(HostAddress *)hbuf);
          goto LAB_001508bd;
        }
        __pai = &paVar3->ai_next;
      }
      if (uniqueAddresses._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        __return_storage_ptr__->m_error = UnknownError;
        std::__cxx11::string::string
                  ((string *)hbuf,"HostInfo: unknown address types found",(allocator *)local_504);
        std::__cxx11::string::_M_assign((string *)psVar1);
        goto LAB_00150a4f;
      }
    }
    freeaddrinfo((addrinfo *)res);
    goto LAB_00150a66;
  }
  iVar5 = atoi((port->_M_dataplus)._M_p);
  NVar6 = HostAddress::GetProtocol(&address);
  if (NVar6 == IPv4Protocol) {
    local_4e8.sa_data[6] = '\0';
    local_4e8.sa_data[7] = '\0';
    local_4e8.sa_data[8] = '\0';
    local_4e8.sa_data[9] = '\0';
    local_4e8.sa_data[10] = '\0';
    local_4e8.sa_data[0xb] = '\0';
    local_4e8.sa_data[0xc] = '\0';
    local_4e8.sa_data[0xd] = '\0';
    local_4e8.sa_family = 2;
    uVar7 = HostAddress::GetIPv4Address(&address);
    local_4e8.sa_data._2_4_ =
         uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    __sa = &local_4e8;
    __salen = 0x10;
LAB_00150928:
    *(ushort *)__sa->sa_data = (ushort)iVar5 << 8 | (ushort)iVar5 >> 8;
    iVar5 = getnameinfo(__sa,__salen,hbuf,0x401,serv,0x20,0);
    if (iVar5 == 0) {
      std::__cxx11::string::string((string *)&res,hbuf,&local_529);
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&res);
    }
  }
  else {
    NVar6 = HostAddress::GetProtocol(&address);
    if (NVar6 == IPv4Protocol) {
      local_504[4] = '\0';
      local_504[5] = '\0';
      local_504[6] = '\0';
      local_504[7] = '\0';
      local_504[8] = '\0';
      local_504[9] = '\0';
      local_504[10] = '\0';
      local_504[0xb] = '\0';
      uStack_4f8 = 0;
      uStack_4f0 = 0;
      uStack_4ec = 0;
      local_504._0_2_ = 10;
      IVar8 = HostAddress::GetIPv6Address(&address);
      __sa = (sockaddr *)local_504;
      local_504._8_4_ = IVar8.data._0_4_;
      uStack_4f8 = IVar8.data._4_8_;
      uStack_4f0 = IVar8.data._12_4_;
      __salen = 0x1c;
      goto LAB_00150928;
    }
  }
  std::__cxx11::string::string((string *)&res,(string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&res);
  if (local_520 == 0) {
    HostAddress::GetIPString_abi_cxx11_((string *)&res,&address);
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&res);
  }
  std::
  _Rb_tree<BamTools::Internal::HostAddress,BamTools::Internal::HostAddress,std::_Identity<BamTools::Internal::HostAddress>,std::less<BamTools::Internal::HostAddress>,std::allocator<BamTools::Internal::HostAddress>>
  ::_M_insert_unique<BamTools::Internal::HostAddress_const&>
            ((_Rb_tree<BamTools::Internal::HostAddress,BamTools::Internal::HostAddress,std::_Identity<BamTools::Internal::HostAddress>,std::less<BamTools::Internal::HostAddress>,std::allocator<BamTools::Internal::HostAddress>>
              *)&uniqueAddresses,&address);
LAB_00150a66:
  std::vector<BamTools::Internal::HostAddress,std::allocator<BamTools::Internal::HostAddress>>::
  vector<std::_Rb_tree_const_iterator<BamTools::Internal::HostAddress>,void>
            ((vector<BamTools::Internal::HostAddress,std::allocator<BamTools::Internal::HostAddress>>
              *)hbuf,(_Rb_tree_const_iterator<BamTools::Internal::HostAddress>)
                     uniqueAddresses._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<BamTools::Internal::HostAddress>)__last,(allocator_type *)serv
            );
  std::vector<BamTools::Internal::HostAddress,_std::allocator<BamTools::Internal::HostAddress>_>::
  operator=(&__return_storage_ptr__->m_addresses,
            (vector<BamTools::Internal::HostAddress,_std::allocator<BamTools::Internal::HostAddress>_>
             *)hbuf);
  std::vector<BamTools::Internal::HostAddress,_std::allocator<BamTools::Internal::HostAddress>_>::
  ~vector((vector<BamTools::Internal::HostAddress,_std::allocator<BamTools::Internal::HostAddress>_>
           *)hbuf);
  std::__cxx11::string::~string((string *)&address.m_ipString);
  std::
  _Rb_tree<BamTools::Internal::HostAddress,_BamTools::Internal::HostAddress,_std::_Identity<BamTools::Internal::HostAddress>,_std::less<BamTools::Internal::HostAddress>,_std::allocator<BamTools::Internal::HostAddress>_>
  ::~_Rb_tree(&uniqueAddresses._M_t);
  return __return_storage_ptr__;
}

Assistant:

HostInfo HostInfo::Lookup(const std::string& hostname, const std::string& port)
{

    HostInfo result;
    result.SetHostName(hostname);
    std::set<HostAddress> uniqueAddresses;

#ifdef _WIN32
    WindowsSockInit init;
#endif

    HostAddress address;
    address.SetAddress(hostname);

    // if hostname is an IP string ('0.0.0.0' or IPv6 format)
    // do reverse lookup for host domain name
    //
    // TODO: might just remove this... not sure if proper 'hostname' from IP string is needed
    //
    //       so far, haven't been able to successfully fetch a domain name with reverse DNS
    //       getnameinfo() on test sites just returns original IP string. BUT this is likely a rare
    //       case that client code tries to use an IP string and the connection should work fine
    //       anyway. GetHostName() just won't quite show what I was hoping for. :(
    if (address.HasIPAddress()) {

        const uint16_t portNum = static_cast<uint16_t>(std::atoi(port.c_str()));

        sockaddr_in sa4;
        sockaddr_in6 sa6;
        sockaddr* sa = 0;
        BT_SOCKLEN_T saSize = 0;

        // IPv4
        if (address.GetProtocol() == HostAddress::IPv4Protocol) {
            sa = (sockaddr*)&sa4;
            saSize = sizeof(sa4);
            std::memset(&sa4, 0, sizeof(sa4));
            sa4.sin_family = AF_INET;
            sa4.sin_addr.s_addr = htonl(address.GetIPv4Address());
            sa4.sin_port = htons(portNum);
        }

        // IPv6
        else if (address.GetProtocol() == HostAddress::IPv4Protocol) {
            sa = (sockaddr*)&sa6;
            saSize = sizeof(sa6);
            std::memset(&sa6, 0, sizeof(sa6));
            sa6.sin6_family = AF_INET6;
            std::memcpy(sa6.sin6_addr.s6_addr, address.GetIPv6Address().data,
                        sizeof(sa6.sin6_addr.s6_addr));
            sa6.sin6_port = htons(portNum);
        }

        // unknown (should be unreachable)
        else {
            BT_ASSERT_X(false, "HostInfo::Lookup: unknown network protocol");
        }

        // lookup name for IP
        char hbuf[NI_MAXHOST];
        char serv[NI_MAXSERV];
        if (sa && (getnameinfo(sa, saSize, hbuf, sizeof(hbuf), serv, sizeof(serv), 0) == 0)) {
            result.SetHostName(std::string(hbuf));
        }

        // if no domain name found, just use the original address's IP string
        if (result.HostName().empty()) {
            result.SetHostName(address.GetIPString());
        }

        // store address in HostInfo
        uniqueAddresses.insert(address);
    }

    // otherwise, hostname is a domain name ('www.foo.bar')
    // do 'normal' lookup
    else {

        // setup address lookup 'hints'
        addrinfo hints;
        std::memset(&hints, 0, sizeof(hints));
        hints.ai_family = AF_UNSPEC;      // allow either IPv4 or IPv6
        hints.ai_socktype = SOCK_STREAM;  // for TCP
        hints.ai_protocol = IPPROTO_TCP;

        // fetch addresses for requested hostname/port
        addrinfo* res;
        int status = getaddrinfo(hostname.c_str(), port.c_str(), &hints, &res);

        // if everything OK
        if (status == 0) {

            // iterate over all IP addresses found
            addrinfo* p = res;
            for (; p != NULL; p = p->ai_next) {

                // IPv4
                if (p->ai_family == AF_INET) {
                    sockaddr_in* ipv4 = (sockaddr_in*)p->ai_addr;
                    HostAddress a(ntohl(ipv4->sin_addr.s_addr));
                    uniqueAddresses.insert(a);
                }

                // IPv6
                else if (p->ai_family == AF_INET6) {
                    sockaddr_in6* ipv6 = (sockaddr_in6*)p->ai_addr;
                    HostAddress a(ipv6->sin6_addr.s6_addr);
                    uniqueAddresses.insert(a);
                }
            }

            // if we iterated, but no addresses were stored
            if (uniqueAddresses.empty() && (p == NULL)) {
                result.SetError(HostInfo::UnknownError);
                result.SetErrorString("HostInfo: unknown address types found");
            }
        }

        // handle error cases
        else if (
#ifndef _WIN32
            status == EAI_NONAME || status == EAI_FAIL
#ifdef EAI_NODATA
            || status == EAI_NODATA  // officially deprecated, but just in case we happen to hit it
#endif                               // EAI_NODATA

#else   // _WIN32
            WSAGetLastError() == WSAHOST_NOT_FOUND || WSAGetLastError() == WSANO_DATA ||
            WSAGetLastError() == WSANO_RECOVERY
#endif  // _WIN32
        ) {
            result.SetError(HostInfo::HostNotFound);
            result.SetErrorString("HostInfo: host not found");
        } else {
            result.SetError(HostInfo::UnknownError);
            result.SetErrorString("HostInfo: unknown error encountered");
        }